

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<int,fmt::v6::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<int,fmt::v6::basic_format_specs<char>>::num_writer>
             *this,char **it)

{
  size_t sVar1;
  char *__s;
  char *pcVar2;
  ptrdiff_t _Num;
  
  sVar1 = *(size_t *)(this + 0x10);
  if (sVar1 != 0) {
    pcVar2 = *it;
    memmove(pcVar2,*(void **)(this + 8),sVar1);
    *it = pcVar2 + sVar1;
  }
  __s = *it;
  sVar1 = *(size_t *)(this + 0x20);
  pcVar2 = __s;
  if (sVar1 != 0) {
    pcVar2 = __s + sVar1;
    memset(__s,*(int *)(this + 0x18),sVar1);
  }
  *it = pcVar2;
  int_writer<int,fmt::v6::basic_format_specs<char>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }